

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O1

void __thiscall Trainer::Trainer<Kuhn::Game>::train(Trainer<Kuhn::Game> *this,int iterations)

{
  string *psVar1;
  Game *pGVar2;
  Node *pNVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ostream *poVar9;
  _Hash_node_base *p_Var10;
  int playerIndex;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double adStack_60 [2];
  double local_48;
  ulong local_40;
  uint local_34;
  
  adStack_60[0] = 5.40622439780159e-318;
  uVar7 = Kuhn::Game::playerNum();
  lVar5 = -((ulong)uVar7 * 8 + 0xf & 0xfffffffffffffff0);
  lVar6 = lVar5 + -0x58;
  local_34 = iterations;
  if (0 < iterations) {
    uVar7 = 0;
    do {
      *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b284;
      iVar8 = Kuhn::Game::playerNum();
      if (0 < iVar8) {
        lVar11 = 0;
        do {
          if (this->mUpdate[lVar11] == true) {
            psVar1 = this->mModeStr;
            *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b2b4;
            iVar8 = std::__cxx11::string::compare((char *)psVar1);
            pGVar2 = this->mGame;
            playerIndex = (int)lVar11;
            if (iVar8 == 0) {
              *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b356;
              Kuhn::Game::reset(pGVar2,false);
              pGVar2 = this->mGame;
              *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b373;
              dVar13 = CFR(this,pGVar2,playerIndex,1.0,1.0);
              *(double *)((long)adStack_60 + lVar11 * 8 + lVar6 + 0x60) = dVar13;
              for (p_Var10 = (this->mNodeMap)._M_h._M_before_begin._M_nxt;
                  p_Var10 != (_Hash_node_base *)0x0; p_Var10 = p_Var10->_M_nxt) {
                pNVar3 = (Node *)p_Var10[5]._M_nxt;
                *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b38f;
                Node::updateStrategy(pNVar3);
              }
            }
            else {
              *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b2cd;
              Kuhn::Game::reset(pGVar2,true);
              psVar1 = this->mModeStr;
              *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b2e0;
              iVar8 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar8 == 0) {
                pGVar2 = this->mGame;
                *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b3b2;
                dVar13 = chanceSamplingCFR(this,pGVar2,playerIndex,1.0,1.0);
                *(double *)((long)adStack_60 + lVar11 * 8 + lVar6 + 0x60) = dVar13;
                for (p_Var10 = (this->mNodeMap)._M_h._M_before_begin._M_nxt;
                    p_Var10 != (_Hash_node_base *)0x0; p_Var10 = p_Var10->_M_nxt) {
                  pNVar3 = (Node *)p_Var10[5]._M_nxt;
                  *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b3ce;
                  Node::updateStrategy(pNVar3);
                }
              }
              else {
                psVar1 = this->mModeStr;
                *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b2fb;
                iVar8 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar8 == 0) {
                  pGVar2 = this->mGame;
                  *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b3e6;
                  dVar13 = externalSamplingCFR(this,pGVar2,playerIndex);
                }
                else {
                  psVar1 = this->mModeStr;
                  *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b316;
                  iVar8 = std::__cxx11::string::compare((char *)psVar1);
                  if (iVar8 != 0) {
                    *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b591;
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                                  ,0x127,
                                  "void Trainer::Trainer<Kuhn::Game>::train(const int) [T = Kuhn::Game]"
                                 );
                  }
                  pGVar2 = this->mGame;
                  *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b345;
                  outcomeSamplingCFR((Trainer<Kuhn::Game> *)&stack0xffffffffffffffb0,(Game *)this,
                                     (int)pGVar2,playerIndex,1.0,1.0,1.0);
                  dVar13 = local_48;
                }
                *(double *)((long)adStack_60 + lVar11 * 8 + lVar6 + 0x60) = dVar13;
              }
            }
          }
          lVar11 = lVar11 + 1;
          *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b3f4;
          iVar8 = Kuhn::Game::playerNum();
        } while (lVar11 < iVar8);
      }
      uVar12 = (ulong)uVar7;
      if ((uVar7 * 0x26e978d5 >> 3 | uVar7 * -0x60000000) < 0x418938) {
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b42f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iteration:",10);
        local_40 = (ulong)uVar7;
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b43e;
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b455;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,", cumulative nodes touched: ",0x1c);
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b464;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b47b;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", infosets num: ",0x10);
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b48a;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b49e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", expected payoffs: (",0x15);
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b4a3;
        iVar8 = Kuhn::Game::playerNum();
        if (0 < iVar8) {
          lVar11 = 0;
          do {
            dVar13 = *(double *)((long)adStack_60 + lVar11 * 8 + lVar6 + 0x60);
            *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b4bf;
            poVar9 = std::ostream::_M_insert<double>(dVar13);
            *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b4cf;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
            lVar11 = lVar11 + 1;
            *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b4d7;
            iVar8 = Kuhn::Game::playerNum();
          } while (lVar11 < iVar8);
        }
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b4f2;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
        uVar4 = *(undefined8 *)(std::cout + -0x18);
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b507;
        std::ios::widen((char)uVar4 + '0');
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b512;
        std::ostream::put('0');
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b51a;
        std::ostream::flush();
        uVar12 = local_40;
      }
      iVar8 = (int)uVar12;
      if ((iVar8 != 0) && (iVar8 == (int)((uVar12 & 0xffffffff) / 10000000) * 10000000)) {
        *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b549;
        writeStrategyToBin(this,iVar8);
      }
      uVar7 = iVar8 + 1;
    } while (uVar7 != local_34);
  }
  *(undefined8 *)((long)adStack_60 + lVar5) = 0x10b563;
  writeStrategyToBin(this,-1);
  return;
}

Assistant:

void Trainer<T>::train(const int iterations) {
    double utils[mGame->playerNum()];

    for (int i = 0; i < iterations; ++i) {
        for (int p = 0; p < mGame->playerNum(); ++p) {
            if (!mUpdate[p]) {
                continue;
            }
            if (mModeStr == "vanilla") {
                mGame->reset(false);
                utils[p] = CFR(*mGame, p, 1.0, 1.0);
                for (auto & itr : mNodeMap) {
                    itr.second->updateStrategy();
                }
            } else {
                mGame->reset();
                if (mModeStr == "chance") {
                    utils[p] = chanceSamplingCFR(*mGame, p, 1.0, 1.0);
                    for (auto & itr : mNodeMap) {
                        itr.second->updateStrategy();
                    }
                } else if (mModeStr == "external") {
                    utils[p] = externalSamplingCFR(*mGame, p);
                } else if (mModeStr == "outcome") {
                    utils[p] = std::get<0>(outcomeSamplingCFR(*mGame, p, i, 1.0, 1.0, 1.0));
                } else {
                    assert(false);
                }
            }
        }
        if (i % 1000 == 0) {
            std::cout << "iteration:" << i << ", cumulative nodes touched: " << mNodeTouchedCnt << ", infosets num: " << mNodeMap.size() << ", expected payoffs: (";
            for (int p = 0; p < mGame->playerNum(); ++p) {
                std::cout << utils[p] << ",";
            }
            std::cout << ")" << std::endl;
        }
        if (i != 0 && i % 10000000 == 0) {
            writeStrategyToBin(i);
        }
    }

    writeStrategyToBin();
}